

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::DepthShader::shadeFragments
          (DepthShader *this,FragmentPacket *packets,int numPackets,FragmentShadingContext *context)

{
  int iVar1;
  GenericVec4 *pGVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  Vec4 color;
  Vector<float,_4> local_20;
  
  tcu::Vector<float,_4>::Vector(&local_20,(float (*) [4])&this->u_color->value);
  pGVar2 = context->outputArray;
  iVar1 = context->numFragmentOutputs;
  uVar3 = 0;
  uVar4 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar4 = uVar3;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      iVar6 = ((uint)lVar5 | (int)uVar3 * 4) * iVar1;
      pGVar2[iVar6].v.uData[0] = (deUint32)local_20.m_data[0];
      pGVar2[iVar6].v.uData[1] = (deUint32)local_20.m_data[1];
      pGVar2[iVar6].v.uData[2] = (deUint32)local_20.m_data[2];
      pGVar2[iVar6].v.uData[3] = (deUint32)local_20.m_data[3];
    }
  }
  return;
}

Assistant:

void DepthShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 color(u_color.value.f4);

	DE_UNREF(packets);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
}